

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_getint(Table *t,lua_Integer key)

{
  ulong uVar1;
  int *piVar2;
  Node *pNVar3;
  ulong uVar4;
  
  uVar4 = (ulong)t->alimit;
  uVar1 = key - 1;
  if (uVar4 <= uVar1) {
    if ((-1 < (char)t->flags) || (uVar4 <= (-uVar4 & uVar1))) {
      pNVar3 = hashint(t,key);
      while (((pNVar3->u).key_tt != '\x03' || ((pNVar3->u).key_val.gc != (GCObject *)key))) {
        piVar2 = &(pNVar3->u).next;
        pNVar3 = pNVar3 + *piVar2;
        if ((long)*piVar2 == 0) {
          return &absentkey;
        }
      }
      return (TValue *)pNVar3;
    }
    t->alimit = (uint)key;
  }
  return t->array + uVar1;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  lua_Unsigned alimit = t->alimit;
  if (l_castS2U(key) - 1u < alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!isrealasize(t) &&  /* key still may be in the array part? */
           (((l_castS2U(key) - 1u) & ~(alimit - 1u)) < alimit)) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {  /* key is not in the array part; check the hash */
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}